

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_cmELF_&)>
* anon_unknown.dwarf_281804::MakeEmptyCallback
            (function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_cmELF_&)>
             *__return_storage_ptr__,string *newRPath)

{
  string local_38 [32];
  string *local_18;
  string *newRPath_local;
  
  local_18 = newRPath;
  newRPath_local = (string *)__return_storage_ptr__;
  std::__cxx11::string::string(local_38,(string *)newRPath);
  std::function<bool(std::__cxx11::string*,cmELF_const&)>::
  function<(anonymous_namespace)::MakeEmptyCallback(std::__cxx11::string_const&)::__0,void>
            ((function<bool(std::__cxx11::string*,cmELF_const&)> *)__return_storage_ptr__,
             (anon_class_32_1_393cdf75 *)local_38);
  (anonymous_namespace)::MakeEmptyCallback(std::__cxx11::string_const&)::$_0::~__0((__0 *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::function<bool(std::string*, const cmELF&)> MakeEmptyCallback(
  const std::string& newRPath)
{
  return [newRPath](std::string* emsg, const cmELF& elf) -> bool {
    if (newRPath.empty()) {
      // The new rpath is empty and there is no rpath anyway so it is
      // okay.
      return true;
    }
    if (emsg) {
      *emsg =
        cmStrCat("No valid ELF RPATH or RUNPATH entry exists in the file; ",
                 elf.GetErrorMessage());
    }
    return false;
  };
}